

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_privileged.inc.c
# Opt level: O0

_Bool trans_ebreak(DisasContext_conflict12 *ctx,arg_ebreak *a)

{
  arg_ebreak *a_local;
  DisasContext_conflict12 *ctx_local;
  
  generate_exception(ctx,3);
  exit_tb(ctx);
  (ctx->base).is_jmp = DISAS_NORETURN;
  return true;
}

Assistant:

static bool trans_ebreak(DisasContext *ctx, arg_ebreak *a)
{
    // ignore this instruction
    generate_exception(ctx, RISCV_EXCP_BREAKPOINT);
    exit_tb(ctx); /* no chaining */
    ctx->base.is_jmp = DISAS_NORETURN;
    return true;
}